

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsv.cpp
# Opt level: O0

int main(void)

{
  ushort uVar1;
  Am_Object *pAVar2;
  Am_Value *pAVar3;
  Am_Constraint *pAVar4;
  Am_Object AVar5;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object c;
  Am_Object local_18;
  Am_Object button;
  
  button.data._4_4_ = 0;
  Am_Object::Am_Object(&local_18);
  Am_Initialize();
  Am_Object::Create((char *)&c);
  uVar1 = Am_Object::Set((ushort)&c,0x65,10);
  uVar1 = Am_Object::Set(uVar1,100,10);
  uVar1 = Am_Object::Set(uVar1,0.0,0x181);
  uVar1 = Am_Object::Set(uVar1,360.0,0x182);
  uVar1 = Am_Object::Set(uVar1,1.0,0x183);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,10.0,0x184);
  Am_Object::operator=(&H,pAVar2);
  Am_Object::~Am_Object(&c);
  Am_Object::Am_Object(&local_38);
  pAVar3 = (Am_Value *)Am_Object::Get(0x61c8,0xc5);
  Am_Object::operator=(&local_38,pAVar3);
  Am_Object::Set((ushort)&local_38,0.0,0x169);
  Am_Object::Create((char *)&local_40);
  uVar1 = Am_Object::Set((ushort)&local_40,100,5);
  uVar1 = Am_Object::Set(uVar1,0x65,0xdc);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)hue_text);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,(Am_Constraint *)0xab,(ulong)pAVar4);
  Am_Object::operator=(&ht,pAVar2);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Create((char *)&local_48);
  uVar1 = Am_Object::Set((ushort)&local_48,0x65,10);
  uVar1 = Am_Object::Set(uVar1,100,0x28);
  uVar1 = Am_Object::Set(uVar1,0.0,0x181);
  uVar1 = Am_Object::Set(uVar1,1.0,0x182);
  uVar1 = Am_Object::Set(uVar1,0.01,0x183);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,0.1,0x184);
  Am_Object::operator=(&S,pAVar2);
  Am_Object::~Am_Object(&local_48);
  pAVar3 = (Am_Value *)Am_Object::Get(0x61d0,0xc5);
  Am_Object::operator=(&local_38,pAVar3);
  Am_Object::Set((ushort)&local_38,0.8,0x169);
  Am_Object::Create((char *)&local_50);
  uVar1 = Am_Object::Set((ushort)&local_50,100,0x28);
  uVar1 = Am_Object::Set(uVar1,0x65,0xdc);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)sat_text);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,(Am_Constraint *)0xab,(ulong)pAVar4);
  Am_Object::operator=(&st,pAVar2);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Create((char *)&local_58);
  uVar1 = Am_Object::Set((ushort)&local_58,0x65,10);
  uVar1 = Am_Object::Set(uVar1,100,0x46);
  uVar1 = Am_Object::Set(uVar1,0.0,0x181);
  uVar1 = Am_Object::Set(uVar1,1.0,0x182);
  uVar1 = Am_Object::Set(uVar1,0.01,0x183);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,0.1,0x184);
  Am_Object::operator=(&V,pAVar2);
  Am_Object::~Am_Object(&local_58);
  pAVar3 = (Am_Value *)Am_Object::Get(0x61d8,0xc5);
  Am_Object::operator=(&local_38,pAVar3);
  Am_Object::Set((ushort)&local_38,0.8,0x169);
  Am_Object::Create((char *)&local_60);
  uVar1 = Am_Object::Set((ushort)&local_60,100,0x46);
  uVar1 = Am_Object::Set(uVar1,0x65,0xdc);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)value_text);
  pAVar2 = (Am_Object *)Am_Object::Set(uVar1,(Am_Constraint *)0xab,(ulong)pAVar4);
  Am_Object::operator=(&vt,pAVar2);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Create((char *)&local_70);
  uVar1 = Am_Object::Set((ushort)&local_70,0x65,0x32);
  uVar1 = Am_Object::Set(uVar1,100,0x32);
  uVar1 = Am_Object::Set(uVar1,0x66,100);
  uVar1 = Am_Object::Set(uVar1,0x67,0x122);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)fill_from_scrolls);
  AVar5.data = (Am_Object_Data *)Am_Object::Set(uVar1,(Am_Constraint *)0x6a,(ulong)pAVar4);
  Am_Object::Create((char *)&local_80);
  uVar1 = Am_Object::Set((ushort)&local_80,100,10);
  uVar1 = Am_Object::Set(uVar1,0x65,0xfa);
  uVar1 = Am_Object::Set(uVar1,0x66,0x50);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)fill_from_scrolls);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x6a,(ulong)pAVar4);
  Am_Object::Create((char *)&local_90);
  pAVar2 = (Am_Object *)Am_Object::Set((ushort)&local_90,(char *)0x150,0x10408e);
  Am_Object::Am_Object(&local_88,pAVar2);
  pAVar2 = (Am_Object *)Am_Object::Set_Part(uVar1,(Am_Object)0xc5,(ulong)&local_88);
  Am_Object::Am_Object(&local_78,pAVar2);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_78,0),1);
  Am_Object::Am_Object(&local_98,&H);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_98,0),1);
  Am_Object::Am_Object(&local_a0,&S);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_a0,0),1);
  Am_Object::Am_Object(&local_a8,&V);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_a8,0),1);
  Am_Object::Am_Object(&local_b0,&ht);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_b0,0),1);
  Am_Object::Am_Object(&local_b8,&st);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_b8,0),1);
  Am_Object::Am_Object(&local_c0,&vt);
  pAVar2 = (Am_Object *)Am_Object::Add_Part(AVar5,SUB81(&local_c0,0),1);
  Am_Object::Am_Object(&local_68,pAVar2);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_68,0),1);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_70);
  Am_Main_Event_Loop();
  Am_Cleanup();
  button.data._4_4_ = 0;
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_18);
  return button.data._4_4_;
}

Assistant:

int
main(void)
{
  Am_Object button;
  Am_Initialize();

  H = Am_Vertical_Scroll_Bar.Create("Hue")
          .Set(Am_TOP, 10)
          .Set(Am_LEFT, 10)
          .Set(Am_VALUE_1, 0.0)
          .Set(Am_VALUE_2, 360.0)
          .Set(Am_SMALL_INCREMENT, 1.0)
          .Set(Am_LARGE_INCREMENT, 10.0);
  Am_Object c;
  c = H.Get(Am_COMMAND);
  c.Set(Am_VALUE, 0.0);

  ht = Am_Text.Create("Hue")
           .Set(Am_LEFT, 5)
           .Set(Am_TOP, 220)
           .Set(Am_TEXT, hue_text);

  S = Am_Vertical_Scroll_Bar.Create("Sat")
          .Set(Am_TOP, 10)
          .Set(Am_LEFT, 40)
          .Set(Am_VALUE_1, 0.0)
          .Set(Am_VALUE_2, 1.0)
          .Set(Am_SMALL_INCREMENT, 0.01)
          .Set(Am_LARGE_INCREMENT, 0.1);
  c = S.Get(Am_COMMAND);
  c.Set(Am_VALUE, 0.8);

  st = Am_Text.Create("saturation")
           .Set(Am_LEFT, 40)
           .Set(Am_TOP, 220)
           .Set(Am_TEXT, sat_text);

  V = Am_Vertical_Scroll_Bar.Create("Value")
          .Set(Am_TOP, 10)
          .Set(Am_LEFT, 70)
          .Set(Am_VALUE_1, 0.0)
          .Set(Am_VALUE_2, 1.0)
          .Set(Am_SMALL_INCREMENT, 0.01)
          .Set(Am_LARGE_INCREMENT, 0.1);
  c = V.Get(Am_COMMAND);
  c.Set(Am_VALUE, 0.8);

  vt = Am_Text.Create("Value")
           .Set(Am_LEFT, 70)
           .Set(Am_TOP, 220)
           .Set(Am_TEXT, value_text);

  Am_Screen.Add_Part(
      Am_Window.Create("window")
          .Set(Am_TOP, 50)
          .Set(Am_LEFT, 50)
          .Set(Am_WIDTH, 100)
          .Set(Am_HEIGHT, 290)
          .Set(Am_FILL_STYLE, (fill_from_scrolls))
          .Add_Part(
              Am_Button.Create("button")
                  .Set(Am_LEFT, 10)
                  .Set(Am_TOP, 250)
                  .Set(Am_WIDTH, 80)
                  .Set(Am_FILL_STYLE, fill_from_scrolls)
                  .Set_Part(Am_COMMAND, Am_Quit_No_Ask_Command.Create().Set(
                                            Am_LABEL, "Goodbye")))
          .Add_Part(H)
          .Add_Part(S)
          .Add_Part(V)
          .Add_Part(ht)
          .Add_Part(st)
          .Add_Part(vt));

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}